

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_1::checkRequiredGLRobustnessExtension(EGLint *attribList,Functions *gl)

{
  bool bVar1;
  NotSupportedError *this;
  ApiType apiType;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  EGLint local_4c;
  EGLint minorVersion;
  EGLint majorVersion;
  string local_40;
  
  majorVersion = 1;
  minorVersion = 0;
  parseAttributeValues(attribList,&majorVersion,&minorVersion,&local_4c);
  apiType.m_bits = minorVersion << 4 | majorVersion;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"GL_KHR_robustness",&local_72);
  bVar1 = glu::hasExtension(gl,apiType,&local_70);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_EXT_robustness",&local_71);
    bVar1 = glu::hasExtension(gl,apiType,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar1) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"GL_KHR_robustness and GL_EXT_robustness",&local_72);
      std::operator+(&local_70,&local_40," not supported");
      tcu::NotSupportedError::NotSupportedError
                (this,local_70._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                 ,0x101);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void checkRequiredGLRobustnessExtension (const EGLint* attribList, const glw::Functions& gl)
{
	EGLint				majorVersion			= 1;
	EGLint				minorVersion			= 0;
	EGLint				robustAccessExt			= 0;
	parseAttributeValues(attribList, majorVersion, minorVersion, robustAccessExt);

	glu::ApiType		apiType					= glu::ApiType::es(majorVersion, minorVersion);

	if (!glu::hasExtension(gl, apiType, "GL_KHR_robustness") && !glu::hasExtension(gl, apiType, "GL_EXT_robustness"))
		TCU_THROW(NotSupportedError, (string("GL_KHR_robustness and GL_EXT_robustness") + " not supported").c_str());
}